

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitcell_xml.cpp
# Opt level: O0

void __thiscall UnitcellXMLTest_ReadXML1_Test::TestBody(UnitcellXMLTest_ReadXML1_Test *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  undefined1 uVar4;
  self_type *psVar5;
  Message *message;
  bond_t *pbVar6;
  AssertionResult gtest_ar_5;
  offset_t offset;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  unitcell cell;
  ptree *root;
  ptree pt;
  istringstream is;
  bool *in_stack_fffffffffffffb38;
  unitcell *in_stack_fffffffffffffb40;
  undefined7 in_stack_fffffffffffffb48;
  undefined1 in_stack_fffffffffffffb4f;
  Matrix<long,__1,_1,_0,__1,_1> *in_stack_fffffffffffffb50;
  char *in_stack_fffffffffffffb58;
  undefined7 in_stack_fffffffffffffb60;
  undefined1 in_stack_fffffffffffffb67;
  undefined8 in_stack_fffffffffffffb68;
  Type TVar7;
  AssertHelper *in_stack_fffffffffffffb70;
  char (*in_stack_fffffffffffffb80) [1];
  int iVar8;
  path_type *in_stack_fffffffffffffb88;
  undefined7 in_stack_fffffffffffffb90;
  undefined1 in_stack_fffffffffffffb97;
  char *in_stack_fffffffffffffba0;
  undefined7 in_stack_fffffffffffffba8;
  undefined1 in_stack_fffffffffffffbaf;
  char *in_stack_fffffffffffffbb0;
  AssertionResult *in_stack_fffffffffffffbb8;
  Message *in_stack_fffffffffffffbc8;
  undefined6 in_stack_fffffffffffffbd0;
  AssertionResult local_400;
  undefined8 local_3f0;
  unitcell *in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc3c;
  ptree *in_stack_fffffffffffffc40;
  AssertionResult local_398 [2];
  undefined4 local_374;
  AssertionResult local_370 [2];
  size_t local_350;
  undefined4 local_344;
  AssertionResult local_340 [2];
  size_t local_320;
  undefined4 local_314;
  AssertionResult local_310 [2];
  Message *local_2f0;
  undefined4 local_2e4;
  AssertionResult local_2e0;
  string local_2d0 [55];
  allocator local_299;
  string local_298 [39];
  undefined1 local_271;
  AssertionResult local_270;
  unitcell local_260;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_220;
  self_type *local_1f0;
  allocator local_1a9;
  string local_1a8 [32];
  istringstream local_188 [392];
  
  TVar7 = (Type)((ulong)in_stack_fffffffffffffb68 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1a8,
             "\n<UNITCELL name=\"simple1d\" dimension=\"1\">\n  <VERTEX/>\n  <EDGE><SOURCE vertex=\"1\"/><TARGET vertex=\"1\" offset=\"1\"/></EDGE>\n</UNITCELL>\n    "
             ,&local_1a9);
  std::__cxx11::istringstream::istringstream(local_188,local_1a8,8);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::basic_ptree((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_220,"LATTICES",0x2e);
  psVar5 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::put<char[1]>((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
                          in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  iVar8 = (int)((ulong)in_stack_fffffffffffffb80 >> 0x20);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path((string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x10da55);
  local_1f0 = psVar5;
  boost::property_tree::xml_parser::
  read_xml<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>
            ((basic_istream<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
             (basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffb88,iVar8);
  lattice::unitcell::unitcell(in_stack_fffffffffffffb40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"simple1d",&local_299);
  uVar1 = lattice::read_xml(in_stack_fffffffffffffc40,
                            (string *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                            in_stack_fffffffffffffc30);
  local_271 = uVar1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,(type *)0x10db0f
            );
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_270);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
               (char *)CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8),
               in_stack_fffffffffffffba0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb70,TVar7,
               (char *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
               (int)((ulong)in_stack_fffffffffffffb58 >> 0x20),(char *)in_stack_fffffffffffffb50);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffffbd0)),
               in_stack_fffffffffffffbc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb40);
    std::__cxx11::string::~string(local_2d0);
    testing::Message::~Message((Message *)0x10dd02);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10dd7d);
  local_2e4 = 1;
  message = (Message *)lattice::unitcell::dimension(&local_260);
  local_2f0 = message;
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb58,(char *)in_stack_fffffffffffffb50,
             (int *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48),
             &in_stack_fffffffffffffb40->dim_);
  bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_2e0);
  if (!bVar3) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb70);
    testing::AssertionResult::failure_message((AssertionResult *)0x10de64);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb70,TVar7,
               (char *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
               (int)((ulong)in_stack_fffffffffffffb58 >> 0x20),(char *)in_stack_fffffffffffffb50);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffffbd0)),message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb40);
    testing::Message::~Message((Message *)0x10dec7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10df1f);
  local_314 = 1;
  local_320 = lattice::unitcell::num_sites((unitcell *)0x10df37);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb58,(char *)in_stack_fffffffffffffb50,
             (int *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48),
             &in_stack_fffffffffffffb40->dim_);
  bVar3 = testing::AssertionResult::operator_cast_to_bool(local_310);
  if (!bVar3) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb70);
    testing::AssertionResult::failure_message((AssertionResult *)0x10dfe1);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb70,TVar7,
               (char *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
               (int)((ulong)in_stack_fffffffffffffb58 >> 0x20),(char *)in_stack_fffffffffffffb50);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffffbd0)),message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb40);
    testing::Message::~Message((Message *)0x10e03e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e096);
  local_344 = 1;
  local_350 = lattice::unitcell::num_bonds((unitcell *)0x10e0ae);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb58,(char *)in_stack_fffffffffffffb50,
             (int *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48),
             &in_stack_fffffffffffffb40->dim_);
  bVar3 = testing::AssertionResult::operator_cast_to_bool(local_340);
  if (!bVar3) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb70);
    testing::AssertionResult::failure_message((AssertionResult *)0x10e158);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb70,TVar7,
               (char *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
               (int)((ulong)in_stack_fffffffffffffb58 >> 0x20),(char *)in_stack_fffffffffffffb50);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffffbd0)),message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb40);
    testing::Message::~Message((Message *)0x10e1b5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e20a);
  local_374 = 0;
  lattice::unitcell::bond(in_stack_fffffffffffffb40,(size_t)in_stack_fffffffffffffb38);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb58,(char *)in_stack_fffffffffffffb50,
             (int *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48),
             &in_stack_fffffffffffffb40->dim_);
  bVar3 = testing::AssertionResult::operator_cast_to_bool(local_370);
  if (!bVar3) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb70);
    in_stack_fffffffffffffb70 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x10e2c0);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb70,TVar7,
               (char *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
               (int)((ulong)in_stack_fffffffffffffb58 >> 0x20),(char *)in_stack_fffffffffffffb50);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffffbd0)),message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb40);
    testing::Message::~Message((Message *)0x10e31d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e375);
  pbVar6 = lattice::unitcell::bond(in_stack_fffffffffffffb40,(size_t)in_stack_fffffffffffffb38);
  TVar7 = (Type)((ulong)pbVar6 >> 0x20);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb58,(char *)in_stack_fffffffffffffb50,
             (int *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48),
             &in_stack_fffffffffffffb40->dim_);
  uVar4 = testing::AssertionResult::operator_cast_to_bool(local_398);
  if (!(bool)uVar4) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb70);
    in_stack_fffffffffffffb58 =
         testing::AssertionResult::failure_message((AssertionResult *)0x10e42f);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb70,TVar7,(char *)CONCAT17(uVar4,in_stack_fffffffffffffb60),
               (int)((ulong)in_stack_fffffffffffffb58 >> 0x20),(char *)in_stack_fffffffffffffb50);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffffbd0)),message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb40);
    testing::Message::~Message((Message *)0x10e48c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e4e4);
  Eigen::Matrix<long,_-1,_1,_0,_-1,_1>::Matrix<int>
            (in_stack_fffffffffffffb50,
             (int *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
  local_3f0 = 1;
  Eigen::DenseBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>::operator<<
            ((DenseBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *)
             CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48),
             (Scalar *)in_stack_fffffffffffffb40);
  Eigen::CommaInitializer<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *)0x10e53e);
  pbVar6 = lattice::unitcell::bond(in_stack_fffffffffffffb40,(size_t)in_stack_fffffffffffffb38);
  testing::internal::EqHelper::
  Compare<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_Eigen::Matrix<long,__1,_1,_0,__1,_1>,_nullptr>
            (in_stack_fffffffffffffb58,(char *)pbVar6,
             (Matrix<long,__1,_1,_0,__1,_1> *)
             CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48),
             (Matrix<long,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffb40);
  iVar8 = (int)((ulong)in_stack_fffffffffffffb58 >> 0x20);
  bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_400);
  if (!bVar3) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb70);
    in_stack_fffffffffffffb40 =
         (unitcell *)testing::AssertionResult::failure_message((AssertionResult *)0x10e606);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb70,TVar7,(char *)CONCAT17(uVar4,in_stack_fffffffffffffb60),
               iVar8,(char *)pbVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffffbd0)),message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb40);
    testing::Message::~Message((Message *)0x10e663);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e6b8);
  Eigen::Matrix<long,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<long,__1,_1,_0,__1,_1> *)0x10e6c5);
  lattice::unitcell::~unitcell(in_stack_fffffffffffffb40);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffb40);
  std::__cxx11::istringstream::~istringstream(local_188);
  return;
}

Assistant:

TEST(UnitcellXMLTest, ReadXML1) {
  std::istringstream is(R"(
<UNITCELL name="simple1d" dimension="1">
  <VERTEX/>
  <EDGE><SOURCE vertex="1"/><TARGET vertex="1" offset="1"/></EDGE>
</UNITCELL>
    )");

  ptree pt;
  ptree& root = pt.put("LATTICES", "");
  read_xml(is, root);

  unitcell cell;
  EXPECT_TRUE(read_xml(pt, "simple1d", cell));
  EXPECT_EQ(1, cell.dimension());
  EXPECT_EQ(1, cell.num_sites());
  EXPECT_EQ(1, cell.num_bonds());
  EXPECT_EQ(0, cell.bond(0).source);
  EXPECT_EQ(0, cell.bond(0).target);
  offset_t offset(1);
  offset << 1.0;
  EXPECT_EQ(offset, cell.bond(0).target_offset);
}